

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# clipp.hpp
# Opt level: O1

scoped_dfs_traverser * __thiscall
clipp::detail::scoped_dfs_traverser::operator++(scoped_dfs_traverser *this)

{
  child_t<clipp::parameter,_clipp::group> *pcVar1;
  pointer pcVar2;
  pointer pcVar3;
  bool bVar4;
  char cVar5;
  child_t<clipp::parameter,_clipp::group> *pcVar6;
  pointer pcVar7;
  pointer pcVar8;
  pointer pcVar9;
  
  pcVar7 = (this->pos_).stack_.
           super__Vector_base<clipp::group::depth_first_traverser::context,_std::allocator<clipp::group::depth_first_traverser::context>_>
           ._M_impl.super__Vector_impl_data._M_start;
  pcVar8 = (this->pos_).stack_.
           super__Vector_base<clipp::group::depth_first_traverser::context,_std::allocator<clipp::group::depth_first_traverser::context>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  if (pcVar7 == pcVar8) {
    return this;
  }
  if ((pcVar7->cur)._M_current + 1 == (pcVar7->end)._M_current) {
    do {
      pcVar9 = pcVar7 + 1;
      if (pcVar9 == pcVar8) goto LAB_001379bc;
      pcVar2 = pcVar7 + 1;
      pcVar3 = pcVar7 + 1;
      pcVar7 = pcVar9;
    } while ((pcVar2->cur)._M_current + 1 == (pcVar3->end)._M_current);
    if (pcVar9 == pcVar8) {
LAB_001379bc:
      if ((pcVar8[-1].cur._M_current)->type_ != group) {
        return_to_outermost_scope(this);
        return this;
      }
    }
  }
  if (((this->ignoreBlocks_ != false) || (bVar4 = matched(this), bVar4)) ||
     (((this->pos_).stack_.
       super__Vector_base<clipp::group::depth_first_traverser::context,_std::allocator<clipp::group::depth_first_traverser::context>_>
       ._M_impl.super__Vector_impl_data._M_finish[-1].cur._M_current)->type_ == group)) {
LAB_0013797f:
    group::depth_first_traverser::operator++(&this->pos_);
    goto LAB_00137987;
  }
  pcVar6 = (child_t<clipp::parameter,_clipp::group> *)
           group::depth_first_traverser::outermost_blocking_group_fully_explored(&this->pos_);
  if ((pcVar6 == (child_t<clipp::parameter,_clipp::group> *)0x0) ||
     (bVar4 = group::depth_first_traverser::is_inside(&this->lastMatch_,(group *)pcVar6), bVar4)) {
    pcVar6 = (this->pos_).stack_.
             super__Vector_base<clipp::group::depth_first_traverser::context,_std::allocator<clipp::group::depth_first_traverser::context>_>
             ._M_impl.super__Vector_impl_data._M_finish[-1].cur._M_current;
    if (pcVar6->type_ == group) {
      cVar5 = group::blocking((group *)pcVar6);
    }
    else {
      if (pcVar6->type_ != param) goto LAB_0013797f;
      cVar5 = *(bool *)((long)&pcVar6->m_ + 0x21);
    }
    if (cVar5 == '\0') goto LAB_0013797f;
    pcVar7 = (this->pos_).stack_.
             super__Vector_base<clipp::group::depth_first_traverser::context,_std::allocator<clipp::group::depth_first_traverser::context>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    if ((pcVar7[-1].parent)->exclusive_ == false) goto LAB_00137a6a;
LAB_00137a7e:
    group::depth_first_traverser::next_sibling(&this->pos_);
  }
  else {
    pcVar7 = (this->pos_).stack_.
             super__Vector_base<clipp::group::depth_first_traverser::context,_std::allocator<clipp::group::depth_first_traverser::context>_>
             ._M_impl.super__Vector_impl_data._M_start;
    pcVar8 = (this->pos_).stack_.
             super__Vector_base<clipp::group::depth_first_traverser::context,_std::allocator<clipp::group::depth_first_traverser::context>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    while ((pcVar7 != pcVar8 &&
           (pcVar1 = pcVar8[-1].cur._M_current, pcVar1 != pcVar6 || pcVar1->type_ != group))) {
      pcVar8 = pcVar8 + -1;
      (this->pos_).stack_.
      super__Vector_base<clipp::group::depth_first_traverser::context,_std::allocator<clipp::group::depth_first_traverser::context>_>
      ._M_impl.super__Vector_impl_data._M_finish = pcVar8;
    }
    pcVar7 = (this->pos_).stack_.
             super__Vector_base<clipp::group::depth_first_traverser::context,_std::allocator<clipp::group::depth_first_traverser::context>_>
             ._M_impl.super__Vector_impl_data._M_finish;
LAB_00137a6a:
    if ((this->pos_).stack_.
        super__Vector_base<clipp::group::depth_first_traverser::context,_std::allocator<clipp::group::depth_first_traverser::context>_>
        ._M_impl.super__Vector_impl_data._M_start != pcVar7) {
      pcVar7[-1].cur._M_current = pcVar7[-1].end._M_current + -1;
      goto LAB_00137a7e;
    }
  }
  if ((this->pos_).stack_.
      super__Vector_base<clipp::group::depth_first_traverser::context,_std::allocator<clipp::group::depth_first_traverser::context>_>
      ._M_impl.super__Vector_impl_data._M_start ==
      (this->pos_).stack_.
      super__Vector_base<clipp::group::depth_first_traverser::context,_std::allocator<clipp::group::depth_first_traverser::context>_>
      ._M_impl.super__Vector_impl_data._M_finish) {
    return_to_outermost_scope(this);
  }
LAB_00137987:
  check_if_left_scope(this);
  return this;
}

Assistant:

scoped_dfs_traverser&
    operator ++ ()
    {
        if(!pos_) return *this;

        if(pos_.is_last_in_path()) {
            return_to_outermost_scope();
            return *this;
        }

        //current pattern can block if it didn't match already
        if(ignoreBlocks_ || matched()) {
            ++pos_;
        }
        else if(!pos_->is_group()) {
            //current group can block if we didn't have any match in it
            const group* g = pos_.outermost_blocking_group_fully_explored();
            //no match in 'g' before -> skip to after its siblings
            if(g && !lastMatch_.is_inside(g)) {
                pos_.back_to_ancestor(g).next_after_siblings();
                if(!pos_) return_to_outermost_scope();
            }
            else if(pos_->blocking()) {
                if(pos_.parent().exclusive()) {
                    pos_.next_sibling();
                } else {
                    //no match => skip siblings of blocking param
                    pos_.next_after_siblings();
                }
                if(!pos_) return_to_outermost_scope();
            } else {
                ++pos_;
            }
        } else {
            ++pos_;
        }
        check_if_left_scope();
        return *this;
    }